

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void anon_unknown.dwarf_1924db::ParseError(string *message,Token *token)

{
  DeadlyImportError *this;
  allocator local_59;
  string local_58;
  string local_38;
  Token *local_18;
  Token *token_local;
  string *message_local;
  
  local_18 = token;
  token_local = (Token *)message;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"FBX-Parser",&local_59);
  Assimp::FBX::Util::AddTokenText(&local_38,&local_58,(string *)token_local,local_18);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void ParseError(const std::string& message, const Token& token)
    {
        throw DeadlyImportError(Util::AddTokenText("FBX-Parser",message,&token));
    }